

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

string * clara::detail::normaliseOpt(string *__return_storage_ptr__,string *optName)

{
  string *optName_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)optName);
  return __return_storage_ptr__;
}

Assistant:

inline auto normaliseOpt( std::string const &optName ) -> std::string {
#ifdef CLARA_PLATFORM_WINDOWS
        if( optName[0] == '/' )
            return "-" + optName.substr( 1 );
        else
#endif
            return optName;
    }